

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall
ASDCP::MXF::JPEGXSPictureSubDescriptor::JPEGXSPictureSubDescriptor
          (JPEGXSPictureSubDescriptor *this,Dictionary *d)

{
  byte_t *value;
  UL local_48;
  Dictionary *local_18;
  Dictionary *d_local;
  JPEGXSPictureSubDescriptor *this_local;
  
  local_18 = d;
  d_local = (Dictionary *)this;
  InterchangeObject::InterchangeObject(&this->super_InterchangeObject,d);
  (this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__JPEGXSPictureSubDescriptor_0033c028;
  this->JPEGXSPpih = 0;
  this->JPEGXSPlev = 0;
  this->JPEGXSWf = 0;
  this->JPEGXSHf = 0;
  this->JPEGXSNc = '\0';
  Raw::Raw(&this->JPEGXSComponentTable);
  optional_property<unsigned_short>::optional_property(&this->JPEGXSCw);
  optional_property<unsigned_short>::optional_property(&this->JPEGXSHsl);
  optional_property<unsigned_int>::optional_property(&this->JPEGXSMaximumBitRate);
  if ((this->super_InterchangeObject).m_Dict != (Dictionary *)0x0) {
    value = Dictionary::ul((this->super_InterchangeObject).m_Dict,MDD_JPEGXSPictureSubDescriptor);
    UL::UL(&local_48,value);
    UL::operator=(&(this->super_InterchangeObject).super_KLVPacket.m_UL,&local_48);
    UL::~UL(&local_48);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x14ef,
                "ASDCP::MXF::JPEGXSPictureSubDescriptor::JPEGXSPictureSubDescriptor(const Dictionary *)"
               );
}

Assistant:

JPEGXSPictureSubDescriptor::JPEGXSPictureSubDescriptor(const Dictionary* d) : InterchangeObject(d), JPEGXSPpih(0), JPEGXSPlev(0), JPEGXSWf(0), JPEGXSHf(0), JPEGXSNc(0)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_JPEGXSPictureSubDescriptor);
}